

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5292d::
HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>::HilbertSort3d
          (HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>
           *this,VertexMesh *M,iterator b,iterator e,index_t limit)

{
  difference_type dVar1;
  anon_class_8_1_8991fb9c local_2a0;
  function<void_()> local_298;
  anon_class_8_1_8991fb9c local_278;
  function<void_()> local_270;
  anon_class_8_1_8991fb9c local_250;
  function<void_()> local_248;
  anon_class_8_1_8991fb9c local_228;
  function<void_()> local_220;
  anon_class_8_1_8991fb9c local_200;
  function<void_()> local_1f8;
  anon_class_8_1_8991fb9c local_1d8;
  function<void_()> local_1d0;
  anon_class_8_1_8991fb9c local_1b0;
  function<void_()> local_1a8;
  anon_class_8_1_8991fb9c local_188;
  function<void_()> local_180;
  anon_class_8_1_8991fb9c local_160;
  function<void_()> local_158;
  anon_class_8_1_8991fb9c local_138;
  function<void_()> local_130;
  anon_class_8_1_8991fb9c local_110;
  function<void_()> local_108;
  anon_class_8_1_8991fb9c local_e8;
  function<void_()> local_e0;
  anon_class_8_1_8991fb9c local_b0;
  function<void_()> local_a8;
  anon_class_8_1_8991fb9c local_88;
  function<void_()> local_80;
  Hilbert_vcmp<0,_false,_(anonymous_namespace)::VertexMesh> local_60;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_50;
  uint *local_48;
  HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> *local_40;
  uint *local_38;
  index_t local_2c;
  VertexMesh *pVStack_28;
  index_t limit_local;
  VertexMesh *M_local;
  HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh> *this_local;
  iterator e_local;
  iterator b_local;
  
  this->M_ = M;
  local_2c = limit;
  pVStack_28 = M;
  M_local = (VertexMesh *)this;
  this_local = (HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,_(anonymous_namespace)::VertexMesh>
                *)e._M_current;
  e_local = b;
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m0_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m1_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m2_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m3_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m4_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m5_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m6_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m7_);
  __gnu_cxx::
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  ::__normal_iterator(&this->m8_);
  dVar1 = __gnu_cxx::operator-
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                      *)&this_local,&e_local);
  if (local_2c < (uint)dVar1) {
    dVar1 = __gnu_cxx::operator-
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                        *)&this_local,&e_local);
    if ((uint)dVar1 < 0x400) {
      local_38 = e_local._M_current;
      local_40 = this_local;
      (anonymous_namespace)::
      HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::
      sort<0,false,false,false,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
                (this->M_,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                           )e_local._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                  )this_local,1);
    }
    else {
      (this->m0_)._M_current = e_local._M_current;
      (this->m8_)._M_current = (uint *)this_local;
      local_50._M_current = (this->m0_)._M_current;
      local_58._M_current = (this->m8_)._M_current;
      Hilbert_vcmp<0,_false,_(anonymous_namespace)::VertexMesh>::Hilbert_vcmp(&local_60,pVStack_28);
      local_48 = (uint *)(anonymous_namespace)::
                         reorder_split<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,(anonymous_namespace)::Hilbert_vcmp<0,false,(anonymous_namespace)::VertexMesh>>
                                   (local_50,local_58,local_60);
      (this->m4_)._M_current = local_48;
      local_88.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_1_,void>
                ((function<void()> *)&local_80,&local_88);
      local_b0.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_2_,void>
                ((function<void()> *)&local_a8,&local_b0);
      GEO::parallel(&local_80,&local_a8);
      std::function<void_()>::~function(&local_a8);
      std::function<void_()>::~function(&local_80);
      local_e8.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_3_,void>
                ((function<void()> *)&local_e0,&local_e8);
      local_110.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_4_,void>
                ((function<void()> *)&local_108,&local_110);
      local_138.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_5_,void>
                ((function<void()> *)&local_130,&local_138);
      local_160.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_6_,void>
                ((function<void()> *)&local_158,&local_160);
      GEO::parallel(&local_e0,&local_108,&local_130,&local_158);
      std::function<void_()>::~function(&local_158);
      std::function<void_()>::~function(&local_130);
      std::function<void_()>::~function(&local_108);
      std::function<void_()>::~function(&local_e0);
      local_188.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_7_,void>
                ((function<void()> *)&local_180,&local_188);
      local_1b0.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_8_,void>
                ((function<void()> *)&local_1a8,&local_1b0);
      local_1d8.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_9_,void>
                ((function<void()> *)&local_1d0,&local_1d8);
      local_200.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_10_,void>
                ((function<void()> *)&local_1f8,&local_200);
      local_228.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_11_,void>
                ((function<void()> *)&local_220,&local_228);
      local_250.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_12_,void>
                ((function<void()> *)&local_248,&local_250);
      local_278.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_13_,void>
                ((function<void()> *)&local_270,&local_278);
      local_2a0.this = this;
      std::function<void()>::
      function<(anonymous_namespace)::HilbertSort3d<(anonymous_namespace)::Hilbert_vcmp,(anonymous_namespace)::VertexMesh>::HilbertSort3d((anonymous_namespace)::VertexMesh_const&,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,unsigned_int)::_lambda()_14_,void>
                ((function<void()> *)&local_298,&local_2a0);
      GEO::parallel(&local_180,&local_1a8,&local_1d0,&local_1f8,&local_220,&local_248,&local_270,
                    &local_298);
      std::function<void_()>::~function(&local_298);
      std::function<void_()>::~function(&local_270);
      std::function<void_()>::~function(&local_248);
      std::function<void_()>::~function(&local_220);
      std::function<void_()>::~function(&local_1f8);
      std::function<void_()>::~function(&local_1d0);
      std::function<void_()>::~function(&local_1a8);
      std::function<void_()>::~function(&local_180);
    }
  }
  return;
}

Assistant:

HilbertSort3d(
            const MESH& M,
            vector<index_t>::iterator b,
            vector<index_t>::iterator e,
            index_t limit = 1
        ) :
            M_(M)
        {
            geo_debug_assert(e >= b);
	    geo_cite_with_info(
		"WEB:SpatialSorting",
		"The implementation of spatial sort in GEOGRAM is inspired by "
		"the idea of using \\verb|std::nth_element()| and the recursive"
                " template in the spatial sort package of CGAL"
	    );

            // If the sequence is smaller than the limit, skip it
            if(index_t(e - b) <= limit) {
                return;
            }

            // If the sequence is smaller than 1024, use sequential sorting
            if(index_t(e - b) < 1024) {
                sort<0, false, false, false>(M_, b, e);
                return;
            }

            // Parallel sorting (2 then 4 then 8 sorts in parallel)

// Unfortunately we cannot access consts for template arguments in lambdas in all
// compilers (gcc is OK but not MSVC) so I'm using (ugly) macros here...
	    
#          define COORDX 0
#          define COORDY 1
#          define COORDZ 2
#          define UPX false
#          define UPY false
#          define UPZ false
	    
            m0_ = b;
            m8_ = e;
            m4_ = reorder_split(m0_, m8_, CMP<COORDX, UPX, MESH>(M));

	    
	    parallel(
		[this]() { m2_ = reorder_split(m0_, m4_, CMP<COORDY,  UPY, MESH>(M_)); },
		[this]() { m6_ = reorder_split(m4_, m8_, CMP<COORDY, !UPY, MESH>(M_)); }
	    );

	    parallel(
		[this]() { m1_ = reorder_split(m0_, m2_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m3_ = reorder_split(m2_, m4_, CMP<COORDZ, !UPZ, MESH>(M_)); },
		[this]() { m5_ = reorder_split(m4_, m6_, CMP<COORDZ,  UPZ, MESH>(M_)); },
		[this]() { m7_ = reorder_split(m6_, m8_, CMP<COORDZ, !UPZ, MESH>(M_)); }
	    );

	    parallel(
		[this]() { sort<COORDZ,  UPZ,  UPX,  UPY>(M_, m0_, m1_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m1_, m2_); },
		[this]() { sort<COORDY,  UPY,  UPZ,  UPX>(M_, m2_, m3_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m3_, m4_); },
		[this]() { sort<COORDX,  UPX, !UPY, !UPZ>(M_, m4_, m5_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m5_, m6_); },
		[this]() { sort<COORDY, !UPY,  UPZ, !UPX>(M_, m6_, m7_); },
		[this]() { sort<COORDZ, !UPZ, !UPX,  UPY>(M_, m7_, m8_); }
	    );

#          undef COORDX
#          undef COORDY
#          undef COORDZ
#          undef UPX
#          undef UPY
#          undef UPZ	    
        }